

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_statemachine(Curl_easy *data,connectdata *conn)

{
  long *__s1;
  ulong uVar1;
  anon_union_280_10_9f9d5394_for_proto *pp;
  ushort *puVar2;
  byte bVar3;
  SMTP *pSVar4;
  ulong uVar5;
  curl_slist *pcVar6;
  int iVar7;
  _Bool _Var8;
  unsigned_short uVar9;
  CURLcode CVar10;
  smtpstate sVar11;
  int iVar12;
  long lVar13;
  size_t sVar14;
  char *pcVar15;
  byte *pbVar16;
  smtp_conn *smtpc;
  bool bVar17;
  int smtpcode;
  saslprogress local_50;
  undefined4 uStack_4c;
  size_t local_48;
  dynbuf *local_40;
  size_t nread;
  
  nread = 0;
  if ((conn->proto).smtpc.state == SMTP_UPGRADETLS) {
LAB_001517e3:
    CVar10 = smtp_perform_upgrade_tls(data);
    return CVar10;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar10 = Curl_pp_flushsend(data,&(pp->ftpc).pp);
    return CVar10;
  }
  local_40 = &(conn->proto).ftpc.pp.recvbuf;
  do {
    CVar10 = Curl_pp_readresp(data,0,&(pp->ftpc).pp,&smtpcode,&nread);
    iVar7 = smtpcode;
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    sVar11 = (conn->proto).smtpc.state;
    if (smtpcode != 1 && sVar11 != SMTP_QUIT) {
      (data->info).httpcode = smtpcode;
    }
    if (smtpcode == 0) {
      return CURLE_OK;
    }
    switch(sVar11) {
    case SMTP_SERVERGREET:
      if (99 < smtpcode - 200U) {
        pcVar15 = "Got unexpected smtp-server response: %d";
        goto LAB_00151e19;
      }
      CVar10 = smtp_perform_ehlo(data);
      break;
    case SMTP_EHLO:
      bVar17 = smtpcode != 1;
      pcVar15 = Curl_dyn_ptr(local_40);
      if (iVar7 - 300U < 0xffffff9c && bVar17) {
        if ((1 < (data->set).use_ssl) && (_Var8 = Curl_conn_is_ssl(conn,0), !_Var8))
        goto LAB_00151ddf;
        *(undefined2 *)((long)&conn->proto + 0xbc) = 0;
        CVar10 = Curl_pp_sendf(data,&(pp->ftpc).pp,"HELO %s",(conn->proto).ftpc.newhost);
        if (CVar10 != CURLE_OK) {
          return CVar10;
        }
        smtp_state(data,SMTP_HELO);
      }
      else {
        uVar5 = (conn->proto).ftpc.pp.nfinal;
        if (uVar5 < 4) {
          Curl_failf(data,"Unexpectedly short EHLO response");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        __s1 = (long *)(pcVar15 + 4);
        uVar1 = uVar5 - 4;
        if (uVar1 < 8) {
          if (3 < uVar1) goto LAB_00151c58;
        }
        else if (*__s1 == 0x534c545452415453) {
          pbVar16 = (byte *)((long)&conn->proto + 0xd0);
          *pbVar16 = *pbVar16 | 2;
        }
        else {
LAB_00151c58:
          if ((int)*__s1 == 0x455a4953) {
            pbVar16 = (byte *)((long)&conn->proto + 0xd0);
            *pbVar16 = *pbVar16 | 4;
          }
          else if (uVar1 < 8) {
            if (4 < uVar1) goto LAB_00151ca6;
          }
          else if (*__s1 == 0x3846545550544d53) {
            pbVar16 = (byte *)((long)&conn->proto + 0xd0);
            *pbVar16 = *pbVar16 | 8;
          }
          else {
LAB_00151ca6:
            iVar12 = bcmp(__s1,"AUTH ",5);
            if (iVar12 == 0) {
              pbVar16 = (byte *)((long)&conn->proto + 0xd0);
              *pbVar16 = *pbVar16 | 0x10;
              pbVar16 = (byte *)(pcVar15 + 9);
              lVar13 = uVar5 - 9;
              do {
                lVar13 = -lVar13;
                while( true ) {
                  if (lVar13 == 0) goto LAB_00151cb9;
                  if ((0x20 < (ulong)*pbVar16) ||
                     ((0x100002600U >> ((ulong)*pbVar16 & 0x3f) & 1) == 0)) break;
                  pbVar16 = pbVar16 + 1;
                  lVar13 = lVar13 + 1;
                }
                sVar14 = 0;
                while ((local_48 = -lVar13, lVar13 + sVar14 != 0 &&
                       ((0x20 < (ulong)pbVar16[sVar14] ||
                        (local_48 = sVar14,
                        (0x100002600U >> ((ulong)pbVar16[sVar14] & 0x3f) & 1) == 0))))) {
                  sVar14 = sVar14 + 1;
                }
                uVar9 = Curl_sasl_decode_mech((char *)pbVar16,local_48,(size_t *)&local_50);
                if ((uVar9 != 0) && (CONCAT44(uStack_4c,local_50) == local_48)) {
                  puVar2 = (ushort *)((long)&conn->proto + 0xb8);
                  *puVar2 = *puVar2 | uVar9;
                }
                pbVar16 = pbVar16 + local_48;
                lVar13 = -(lVar13 + local_48);
              } while( true );
            }
          }
        }
LAB_00151cb9:
        if (iVar7 != 1) {
          if (((data->set).use_ssl != '\0') && (_Var8 = Curl_conn_is_ssl(conn,0), !_Var8)) {
            if ((*(byte *)((long)&conn->proto + 0xd0) & 2) != 0) {
              CVar10 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","STARTTLS");
              if (CVar10 != CURLE_OK) {
                return CVar10;
              }
              sVar11 = SMTP_STARTTLS;
              goto LAB_00151ac2;
            }
            if ((data->set).use_ssl != '\x01') {
              Curl_failf(data,"STARTTLS not supported.");
              return CURLE_USE_SSL_FAILED;
            }
          }
          CVar10 = smtp_perform_authentication(data);
          break;
        }
      }
      goto LAB_00151c28;
    case SMTP_HELO:
      if (99 < smtpcode - 200U) {
LAB_00151ddf:
        Curl_failf(data,"Remote access denied: %d",(ulong)(uint)iVar7);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      goto switchD_001518a0_caseD_5;
    case SMTP_STARTTLS:
      if ((data->conn->proto).ftpc.pp.overflow != 0) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (smtpcode == 0xdc) {
        CVar10 = smtp_perform_upgrade_tls(data);
      }
      else {
        if ((data->set).use_ssl != '\x01') {
          Curl_failf(data,"STARTTLS denied, code %d",(ulong)(uint)smtpcode);
          return CURLE_USE_SSL_FAILED;
        }
        CVar10 = smtp_perform_authentication(data);
      }
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      sVar11 = (conn->proto).smtpc.state;
      if (sVar11 != SMTP_UPGRADETLS) goto LAB_00151c2f;
      goto LAB_001517e3;
    default:
      goto switchD_001518a0_caseD_5;
    case SMTP_AUTH:
      CVar10 = Curl_sasl_continue(&(data->conn->proto).imapc.sasl,data,smtpcode,&local_50);
      if (CVar10 == CURLE_OK) {
        if (local_50 == SASL_IDLE) {
          Curl_failf(data,"Authentication cancelled");
          CVar10 = CURLE_LOGIN_DENIED;
        }
        else {
          CVar10 = CURLE_OK;
          if (local_50 == SASL_DONE) {
            CVar10 = CURLE_OK;
            smtp_state(data,SMTP_STOP);
          }
        }
      }
      break;
    case SMTP_COMMAND:
      pSVar4 = (data->req).p.smtp;
      pcVar15 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
      if (iVar7 - 300U < 0xffffff9c && pSVar4->rcpt != (curl_slist *)0x0) {
        if ((iVar7 == 1) || (iVar7 == 0x229)) {
LAB_00151ae0:
          CVar10 = CURLE_OK;
          if (((data->req).field_0xdb & 2) == 0) {
            CVar10 = Curl_client_write(data,1,pcVar15,(data->conn->proto).ftpc.pp.nfinal);
          }
          if (iVar7 != 1) {
            if ((pSVar4->rcpt == (curl_slist *)0x0) ||
               (pcVar6 = pSVar4->rcpt->next, pSVar4->rcpt = pcVar6, pcVar6 == (curl_slist *)0x0)) {
              smtp_state(data,SMTP_STOP);
            }
            else {
              CVar10 = smtp_perform_command(data);
            }
          }
          break;
        }
      }
      else if (((0xffffff9b < iVar7 - 300U) || (iVar7 == 1)) || (pSVar4->rcpt != (curl_slist *)0x0))
      goto LAB_00151ae0;
      pcVar15 = "Command failed: %d";
LAB_00151e19:
      Curl_failf(data,pcVar15,(ulong)(uint)iVar7);
      return CURLE_WEIRD_SERVER_REPLY;
    case SMTP_MAIL:
      if (99 < smtpcode - 200U) {
        pcVar15 = "MAIL failed: %d";
LAB_00151e4a:
        Curl_failf(data,pcVar15,(ulong)(uint)smtpcode);
        return CURLE_SEND_ERROR;
      }
LAB_00151b9a:
      CVar10 = smtp_perform_rcpt_to(data);
      break;
    case SMTP_RCPT:
      pSVar4 = (data->req).p.smtp;
      if (smtpcode - 200U < 100) {
        pSVar4->field_0x28 = pSVar4->field_0x28 | 1;
      }
      else {
        bVar3 = (data->set).field_0x8c0;
        pSVar4->rcpt_last_error = smtpcode;
        if ((bVar3 & 1) == 0) {
          pcVar15 = "RCPT failed: %d";
          goto LAB_00151e4a;
        }
      }
      pcVar6 = pSVar4->rcpt->next;
      pSVar4->rcpt = pcVar6;
      if (pcVar6 != (curl_slist *)0x0) goto LAB_00151b9a;
      if ((pSVar4->field_0x28 & 1) == 0) {
        smtpcode = pSVar4->rcpt_last_error;
        pcVar15 = "RCPT failed: %d (last error)";
        goto LAB_00151e4a;
      }
      CVar10 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","DATA");
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      sVar11 = SMTP_DATA;
      goto LAB_00151ac2;
    case SMTP_DATA:
      if (smtpcode != 0x162) {
        pcVar15 = "DATA failed: %d";
        goto LAB_00151e4a;
      }
      Curl_pgrsSetUploadSize(data,(data->state).infilesize);
      Curl_xfer_setup1(data,2,-1,false);
      goto switchD_001518a0_caseD_5;
    case SMTP_POSTDATA:
      smtp_state(data,SMTP_STOP);
      if (iVar7 != 0xfa) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      goto LAB_00151c28;
    }
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
LAB_00151c28:
    sVar11 = (conn->proto).smtpc.state;
LAB_00151c2f:
    if (sVar11 == SMTP_STOP) {
      return CURLE_OK;
    }
    _Var8 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var8) {
      return CURLE_OK;
    }
  } while( true );
switchD_001518a0_caseD_5:
  sVar11 = SMTP_STOP;
LAB_00151ac2:
  smtp_state(data,sVar11);
  goto LAB_00151c28;
}

Assistant:

static CURLcode smtp_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
upgrade_tls:
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(data);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(data, conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(data, smtpcode, smtpc->state);
      /* During UPGRADETLS, leave the read loop as we need to connect
       * (e.g. TLS handshake) before we continue sending/receiving. */
      if(!result && (smtpc->state == SMTP_UPGRADETLS))
        goto upgrade_tls;
      break;

    case SMTP_AUTH:
      result = smtp_state_auth_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(data, conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
    default:
      /* internal error */
      smtp_state(data, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}